

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

put_transaction<unsigned_short> * __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
::start_emplace<unsigned_short,unsigned_short>
          (put_transaction<unsigned_short> *__return_storage_ptr__,
          heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
          *this,unsigned_short *i_construction_params)

{
  uintptr_t uint_pointer;
  Allocation AVar1;
  put_transaction<unsigned_short> local_40;
  
  AVar1 = inplace_allocate<0ul,true,2ul,2ul>(this);
  density_tests::InstanceCounted::new_instance((InstanceCounted *)(AVar1.m_control_block + 1));
  AVar1.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_short>
       ::s_table;
  *(unsigned_short *)AVar1.m_user_storage = *i_construction_params;
  __return_storage_ptr__->m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       this;
  __return_storage_ptr__->m_put_data = AVar1;
  local_40.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_40.m_put_data = AVar1;
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::put_transaction<unsigned_short>::~put_transaction(&local_40);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }